

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_session.cc
# Opt level: O1

bool bssl::add_session_locked(SSL_CTX *ctx,UniquePtr<SSL_SESSION> *session)

{
  SSL_SESSION **ppSVar1;
  SSL_SESSION *session_00;
  SSL_SESSION *pSVar2;
  _Head_base<0UL,_ssl_session_st_*,_false> session_01;
  bool bVar3;
  int iVar4;
  unsigned_long uVar5;
  size_t sVar6;
  bool bVar7;
  void *old_data_void;
  _Head_base<0UL,_ssl_session_st_*,_false> local_30;
  
  session_00 = (session->_M_t).super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
  local_30._M_head_impl = (pointer)0x0;
  iVar4 = OPENSSL_lh_insert((_LHASH *)ctx->sessions,&local_30._M_head_impl,session_00,
                            lh_SSL_SESSION_call_hash_func,lh_SSL_SESSION_call_cmp_func);
  session_01._M_head_impl = local_30._M_head_impl;
  if (iVar4 == 0) {
LAB_0015d537:
    bVar7 = false;
  }
  else {
    (session->_M_t).super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl = (ssl_session_st *)0x0;
    std::__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>::reset
              ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> *)session,
               local_30._M_head_impl);
    if (session_01._M_head_impl != (pointer)0x0) {
      if (session_01._M_head_impl == session_00) goto LAB_0015d537;
      SSL_SESSION_list_remove(ctx,session_01._M_head_impl);
    }
    if ((session_00->next != (SSL_SESSION *)0x0) && (session_00->prev != (SSL_SESSION *)0x0)) {
      SSL_SESSION_list_remove(ctx,session_00);
    }
    ppSVar1 = &ctx->session_cache_head;
    pSVar2 = ctx->session_cache_head;
    if (pSVar2 == (SSL_SESSION *)0x0) {
      ctx->session_cache_head = session_00;
      ctx->session_cache_tail = session_00;
      session_00->prev = (SSL_SESSION *)ppSVar1;
      session_00->next = (SSL_SESSION *)&ctx->session_cache_tail;
    }
    else {
      session_00->next = pSVar2;
      pSVar2->prev = session_00;
      session_00->prev = (SSL_SESSION *)ppSVar1;
      *ppSVar1 = session_00;
    }
    uVar5 = SSL_CTX_sess_get_cache_size(ctx);
    bVar7 = true;
    if (uVar5 != 0) {
      do {
        sVar6 = OPENSSL_lh_num_items((_LHASH *)ctx->sessions);
        uVar5 = SSL_CTX_sess_get_cache_size(ctx);
        if (sVar6 <= uVar5) {
          return true;
        }
        bVar3 = remove_session(ctx,ctx->session_cache_tail,false);
      } while (bVar3);
    }
  }
  return bVar7;
}

Assistant:

static bool add_session_locked(SSL_CTX *ctx, UniquePtr<SSL_SESSION> session) {
  SSL_SESSION *new_session = session.get();
  SSL_SESSION *old_session;
  if (!lh_SSL_SESSION_insert(ctx->sessions, &old_session, new_session)) {
    return false;
  }
  // |ctx->sessions| took ownership of |new_session| and gave us back a
  // reference to |old_session|. (|old_session| may be the same as
  // |new_session|, in which case we traded identical references with
  // |ctx->sessions|.)
  session.release();
  session.reset(old_session);

  if (old_session != nullptr) {
    if (old_session == new_session) {
      // |session| was already in the cache. There are no linked list pointers
      // to update.
      return false;
    }

    // There was a session ID collision. |old_session| was replaced with
    // |session| in the hash table, so |old_session| must be removed from the
    // linked list to match.
    SSL_SESSION_list_remove(ctx, old_session);
  }

  // This does not increment the reference count. Although |session| is inserted
  // into two structures (a doubly-linked list and the hash table), |ctx| only
  // takes one reference.
  SSL_SESSION_list_add(ctx, new_session);

  // Enforce any cache size limits.
  if (SSL_CTX_sess_get_cache_size(ctx) > 0) {
    while (lh_SSL_SESSION_num_items(ctx->sessions) >
           SSL_CTX_sess_get_cache_size(ctx)) {
      if (!remove_session(ctx, ctx->session_cache_tail,
                          /*lock=*/false)) {
        break;
      }
    }
  }

  return true;
}